

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolSetup(SUNLinearSolver S,SUNMatrix A,int myid)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double stop_time;
  double start_time;
  int failure;
  int myid_local;
  SUNMatrix A_local;
  SUNLinearSolver S_local;
  
  dVar2 = get_time();
  iVar1 = SUNLinSolSetup(S,A);
  dVar3 = get_time();
  if (iVar1 == 0) {
    if ((myid == 0) && (printf("    PASSED test -- SUNLinSolSetup \n"), print_time != 0)) {
      printf("    SUNLinSolSetup Time: %22.15e \n \n",dVar3 - dVar2);
    }
    S_local._4_4_ = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetup check, Proc %d \n",(ulong)(uint)myid);
    if (print_time != 0) {
      printf("    SUNLinSolSetup Time: %22.15e \n \n",dVar3 - dVar2);
    }
    S_local._4_4_ = 1;
  }
  return S_local._4_4_;
}

Assistant:

int Test_SUNLinSolSetup(SUNLinearSolver S, SUNMatrix A, int myid)
{
  int       failure;
  double    start_time, stop_time;

  start_time = get_time();
  failure = SUNLinSolSetup(S, A);
  stop_time = get_time(); 

  if (failure) {
    printf(">>> FAILED test -- SUNLinSolSetup check, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolSetup Time: %22.15e \n \n", stop_time - start_time);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolSetup \n");
    PRINT_TIME("    SUNLinSolSetup Time: %22.15e \n \n", stop_time - start_time);
  }    

  return(0);
}